

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

void stumpless_close_file_target(stumpless_target *target)

{
  if (target == (stumpless_target *)0x0) {
    raise_argument_empty("target was NULL");
    return;
  }
  if (target->type == STUMPLESS_FILE_TARGET) {
    destroy_file_target((file_target *)target->id);
    destroy_target(target);
    clear_error();
    return;
  }
  raise_target_incompatible("target type is incompatible with this operation");
  return;
}

Assistant:

void
stumpless_close_file_target( struct stumpless_target *target ) {
  if( !target ) {
    raise_argument_empty( L10N_NULL_ARG_ERROR_MESSAGE( "target" ) );
    return;
  }

  if( target->type != STUMPLESS_FILE_TARGET ) {
    raise_target_incompatible( L10N_INVALID_TARGET_TYPE_ERROR_MESSAGE );
    return;
  }

  destroy_file_target( target->id );
  destroy_target( target );
  clear_error(  );
}